

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gitlike.cxx
# Opt level: O0

void Add(string *progname,const_iterator beginargs,const_iterator endargs)

{
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  Container *this;
  reference pbVar4;
  EitherFlag *local_1058;
  EitherFlag *local_1030;
  EitherFlag *local_1008;
  EitherFlag *local_fe0;
  Help anon_var_0;
  ParseError e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *spec;
  iterator __end2;
  iterator __begin2;
  Container *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f58;
  allocator local_f31;
  string local_f30;
  allocator local_f09;
  string local_f08;
  undefined1 local_ee8 [8];
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
  pathspec;
  EitherFlag local_e08;
  iterator local_de0;
  undefined1 local_dd8 [127];
  allocator local_d59;
  string local_d58;
  allocator local_d31;
  string local_d30;
  undefined1 local_d10 [8];
  Flag refresh;
  EitherFlag local_bf8;
  EitherFlag local_bd0;
  iterator local_ba8;
  undefined1 local_ba0 [127];
  allocator local_b21;
  string local_b20;
  allocator local_af9;
  string local_af8;
  undefined1 local_ad8 [8];
  Flag verbose;
  EitherFlag local_9c0;
  EitherFlag local_998;
  iterator local_970;
  undefined1 local_968 [127];
  allocator local_8e9;
  string local_8e8;
  allocator local_8c1;
  string local_8c0;
  undefined1 local_8a0 [8];
  Flag dryrun;
  EitherFlag local_788;
  EitherFlag local_760;
  iterator local_738;
  undefined1 local_730 [127];
  allocator local_6b1;
  string local_6b0;
  allocator local_689;
  string local_688;
  undefined1 local_668 [8];
  HelpFlag help;
  string local_538;
  allocator local_501;
  string local_500;
  undefined1 local_4e0 [8];
  ArgumentParser parser;
  string *progname_local;
  const_iterator endargs_local;
  const_iterator beginargs_local;
  
  parser.helpParams.defaultString.field_2._8_8_ = progname;
  poVar2 = std::operator<<((ostream *)&std::cout,"In Add");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_500,"",&local_501);
  std::__cxx11::string::string((string *)&local_538);
  args::ArgumentParser::ArgumentParser((ArgumentParser *)local_4e0,&local_500,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &help.super_Flag.super_FlagBase.matcher.longFlags._M_h._M_single_bucket,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 parser.helpParams.defaultString.field_2._8_8_," add");
  args::ArgumentParser::Prog
            ((ArgumentParser *)local_4e0,
             (string *)&help.super_Flag.super_FlagBase.matcher.longFlags._M_h._M_single_bucket);
  std::__cxx11::string::~string
            ((string *)&help.super_Flag.super_FlagBase.matcher.longFlags._M_h._M_single_bucket);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_688,"help",&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6b0,"Display this help menu",&local_6b1);
  dryrun.super_FlagBase.matcher.longFlags._M_h._M_single_bucket = (__node_base_ptr)&local_788;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)dryrun.super_FlagBase.matcher.longFlags._M_h._M_single_bucket,'h');
  dryrun.super_FlagBase.matcher.longFlags._M_h._M_single_bucket = (__node_base_ptr)&local_760;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)dryrun.super_FlagBase.matcher.longFlags._M_h._M_single_bucket,"help");
  local_738 = &local_788;
  local_730._0_8_ = 2;
  in_02._M_len = 2;
  in_02._M_array = local_738;
  args::Matcher::Matcher((Matcher *)(local_730 + 8),in_02);
  args::HelpFlag::HelpFlag
            ((HelpFlag *)local_668,(Group *)local_4e0,&local_688,&local_6b0,
             (Matcher *)(local_730 + 8),None);
  args::Matcher::~Matcher((Matcher *)(local_730 + 8));
  local_fe0 = (EitherFlag *)&local_738;
  do {
    local_fe0 = local_fe0 + -1;
    args::EitherFlag::~EitherFlag(local_fe0);
  } while (local_fe0 != &local_788);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8c0,"dryrun",&local_8c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e8,"dry run",&local_8e9);
  verbose.super_FlagBase.matcher.longFlags._M_h._M_single_bucket = (__node_base_ptr)&local_9c0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)verbose.super_FlagBase.matcher.longFlags._M_h._M_single_bucket,'n');
  verbose.super_FlagBase.matcher.longFlags._M_h._M_single_bucket = (__node_base_ptr)&local_998;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)verbose.super_FlagBase.matcher.longFlags._M_h._M_single_bucket,"dry-run")
  ;
  local_970 = &local_9c0;
  local_968._0_8_ = 2;
  in_01._M_len = 2;
  in_01._M_array = local_970;
  args::Matcher::Matcher((Matcher *)(local_968 + 8),in_01);
  args::Flag::Flag((Flag *)local_8a0,(Group *)local_4e0,&local_8c0,&local_8e8,
                   (Matcher *)(local_968 + 8),false);
  args::Matcher::~Matcher((Matcher *)(local_968 + 8));
  local_1008 = (EitherFlag *)&local_970;
  do {
    local_1008 = local_1008 + -1;
    args::EitherFlag::~EitherFlag(local_1008);
  } while (local_1008 != &local_9c0);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_af8,"verbose",&local_af9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b20,"be verbose",&local_b21);
  refresh.super_FlagBase.matcher.longFlags._M_h._M_single_bucket = (__node_base_ptr)&local_bf8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)refresh.super_FlagBase.matcher.longFlags._M_h._M_single_bucket,'v');
  refresh.super_FlagBase.matcher.longFlags._M_h._M_single_bucket = (__node_base_ptr)&local_bd0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)refresh.super_FlagBase.matcher.longFlags._M_h._M_single_bucket,"verbose")
  ;
  local_ba8 = &local_bf8;
  local_ba0._0_8_ = 2;
  in_00._M_len = 2;
  in_00._M_array = local_ba8;
  args::Matcher::Matcher((Matcher *)(local_ba0 + 8),in_00);
  args::Flag::Flag((Flag *)local_ad8,(Group *)local_4e0,&local_af8,&local_b20,
                   (Matcher *)(local_ba0 + 8),false);
  args::Matcher::~Matcher((Matcher *)(local_ba0 + 8));
  local_1030 = (EitherFlag *)&local_ba8;
  do {
    local_1030 = local_1030 + -1;
    args::EitherFlag::~EitherFlag(local_1030);
  } while (local_1030 != &local_bf8);
  std::__cxx11::string::~string((string *)&local_b20);
  std::allocator<char>::~allocator((allocator<char> *)&local_b21);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator((allocator<char> *)&local_af9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d30,"refresh",&local_d31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d58,"Don\'t add, only refresh the index",&local_d59)
  ;
  pathspec._208_8_ = &local_e08;
  args::EitherFlag::EitherFlag((EitherFlag *)pathspec._208_8_,"refresh");
  local_de0 = &local_e08;
  local_dd8._0_8_ = 1;
  in._M_len = 1;
  in._M_array = local_de0;
  args::Matcher::Matcher((Matcher *)(local_dd8 + 8),in);
  args::Flag::Flag((Flag *)local_d10,(Group *)local_4e0,&local_d30,&local_d58,
                   (Matcher *)(local_dd8 + 8),false);
  args::Matcher::~Matcher((Matcher *)(local_dd8 + 8));
  local_1058 = (EitherFlag *)&local_de0;
  do {
    local_1058 = local_1058 + -1;
    args::EitherFlag::~EitherFlag(local_1058);
  } while (local_1058 != &local_e08);
  std::__cxx11::string::~string((string *)&local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f08,"pathspec",&local_f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f30,"pathspecs",&local_f31);
  local_f58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f58);
  args::
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
  ::PositionalList((PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
                    *)local_ee8,(Group *)local_4e0,&local_f08,&local_f30,&local_f58,None);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f58);
  std::__cxx11::string::~string((string *)&local_f30);
  std::allocator<char>::~allocator((allocator<char> *)&local_f31);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  args::ArgumentParser::
  ParseArgs<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((ArgumentParser *)local_4e0,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )beginargs._M_current,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )endargs._M_current);
  std::ostream::operator<<(&std::cout,std::boolalpha);
  poVar2 = std::operator<<((ostream *)&std::cout,"dryrun: ");
  bVar1 = args::Base::operator_cast_to_bool((Base *)local_8a0);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"verbose: ");
  bVar1 = args::Base::operator_cast_to_bool((Base *)local_ad8);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"refresh: ");
  bVar1 = args::Base::operator_cast_to_bool((Base *)local_d10);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"pathspec: ");
  bVar1 = args::Base::operator_cast_to_bool((Base *)local_ee8);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = args::Base::operator_cast_to_bool((Base *)local_ee8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"values: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this = args::
           get<args::PositionalList<std::__cxx11::string,args::detail::vector,args::ValueReader>>
                     ((PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
                       *)local_ee8);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this);
    spec = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&spec), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      poVar2 = std::operator<<((ostream *)&std::cout," - ");
      poVar2 = std::operator<<(poVar2,(string *)pbVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  args::
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
  ::~PositionalList((PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
                     *)local_ee8);
  args::Flag::~Flag((Flag *)local_d10);
  args::Flag::~Flag((Flag *)local_ad8);
  args::Flag::~Flag((Flag *)local_8a0);
  args::HelpFlag::~HelpFlag((HelpFlag *)local_668);
  args::ArgumentParser::~ArgumentParser((ArgumentParser *)local_4e0);
  return;
}

Assistant:

void Add(const std::string &progname, std::vector<std::string>::const_iterator beginargs, std::vector<std::string>::const_iterator endargs)
{
    std::cout << "In Add" << std::endl;
    args::ArgumentParser parser("");
    parser.Prog(progname + " add");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    args::Flag dryrun(parser, "dryrun", "dry run", {'n', "dry-run"});
    args::Flag verbose(parser, "verbose", "be verbose", {'v', "verbose"});
    args::Flag refresh(parser, "refresh", "Don't add, only refresh the index", {"refresh"});
    args::PositionalList<std::string> pathspec(parser, "pathspec", "pathspecs");
    try
    {
        parser.ParseArgs(beginargs, endargs);
        std::cout << std::boolalpha;
        std::cout << "dryrun: " << bool{dryrun} << std::endl;;
        std::cout << "verbose: " << bool{verbose} << std::endl;
        std::cout << "refresh: " << bool{refresh} << std::endl;
        std::cout << "pathspec: " << bool{pathspec} << std::endl;
        if (pathspec)
        {
            std::cout << "values: " << std::endl;
            for (const auto &spec: args::get(pathspec))
            {
                std::cout << " - " << spec << std::endl;
            }
        }
    }
    catch (args::Help)
    {
        std::cout << parser;
        return;
    }
    catch (args::ParseError e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return;
    }
}